

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser15.cpp
# Opt level: O2

LibraryAnimationsLoader * __thiscall
COLLADASaxFWL::RootParser15::
beginCommonWithId<COLLADASaxFWL::LibraryAnimationsLoader,COLLADASaxFWL::LibraryAnimationsLoader15>
          (RootParser15 *this,char *id)

{
  FileLoader *pFVar1;
  LibraryAnimationsLoader *this_00;
  LibraryAnimationsLoader15 *this_01;
  
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)this->mFileLoader);
  this_00 = (LibraryAnimationsLoader *)operator_new(0x120);
  LibraryAnimationsLoader::LibraryAnimationsLoader(this_00,(IFilePartLoader *)this->mFileLoader);
  this_01 = (LibraryAnimationsLoader15 *)operator_new(0x28);
  LibraryAnimationsLoader15::LibraryAnimationsLoader15(this_01,this_00);
  (this_00->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.mParserImpl =
       (IParserImpl *)this_01;
  pFVar1 = this->mFileLoader;
  (pFVar1->super_DocumentProcessor).super_IFilePartLoader.mPartLoader = (IFilePartLoader *)this_00;
  (*(pFVar1->super_DocumentProcessor).super_IFilePartLoader.super_ExtraDataLoader.
    _vptr_ExtraDataLoader[10])
            (pFVar1,&(this_01->super_SourceArrayLoader15).super_IParserImpl15.
                     super_ColladaParserAutoGen15);
  DocumentProcessor::addToSidTree(&this->mFileLoader->super_DocumentProcessor,id,(char *)0x0);
  return this_00;
}

Assistant:

Loader* RootParser15::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader15* loader15 = new Loader15(loader);
		loader->setParserImpl( loader15 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader15);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}